

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MagneticField.cpp
# Opt level: O3

void __thiscall OpenMD::MagneticField::modifyForces(MagneticField *this)

{
  double *pdVar1;
  undefined4 *puVar2;
  double dVar3;
  uint uVar4;
  Atom *pAVar5;
  AtomType *pAVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  double dVar9;
  bool bVar10;
  uint i_1;
  Molecule *pMVar11;
  long lVar12;
  double (*padVar13) [3];
  uint i_3;
  ulong uVar14;
  uint j;
  long lVar15;
  ulong uVar16;
  uint i_5;
  long lVar17;
  SquareMatrix3<double> *pSVar18;
  pointer ppAVar19;
  byte bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Vector3d omega;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d f;
  MultipoleAdapter ma;
  Vector3d t;
  Vector<double,_3U> result_1;
  Mat3x3d I;
  double local_1d8 [4];
  double local_1b8 [4];
  FixedChargeAdapter local_198;
  MoleculeIterator local_190;
  double local_188 [4];
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double dStack_150;
  MultipoleAdapter local_148;
  double dStack_140;
  double local_138;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  undefined1 local_108 [16];
  double local_f8;
  double local_e8 [10];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  SquareMatrix3<double> local_78;
  
  bVar20 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_190._M_node = (_Base_ptr)0x0;
  local_188[2] = 0.0;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_f8 = 0.0;
  local_108 = ZEXT816(0);
  local_1b8[2] = 0.0;
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  if (this->doMagneticField == true) {
    pMVar11 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_190);
    if (pMVar11 != (Molecule *)0x0) {
      do {
        for (ppAVar19 = (pMVar11->atoms_).
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            (ppAVar19 !=
             (pMVar11->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish &&
            (pAVar5 = *ppAVar19, pAVar5 != (Atom *)0x0)); ppAVar19 = ppAVar19 + 1) {
          pAVar6 = pAVar5->atomType_;
          lVar15 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar12 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          pdVar1 = (double *)(lVar12 + lVar15 * 0x18);
          local_158 = *pdVar1;
          dStack_150 = pdVar1[1];
          local_168 = *(double *)(lVar12 + 0x10 + lVar15 * 0x18);
          uStack_160 = 0;
          local_198.at_ = pAVar6;
          bVar10 = FixedChargeAdapter::isFixedCharge(&local_198);
          if (bVar10) {
            RVar8 = FixedChargeAdapter::getCharge(&local_198);
            dVar3 = (this->MF).super_Vector<double,_3U>.data_[0];
            dVar23 = (this->MF).super_Vector<double,_3U>.data_[1];
            dVar9 = (this->MF).super_Vector<double,_3U>.data_[2];
            local_148.at_ = (AtomType *)(dVar9 * dStack_150 - local_168 * dVar23);
            dStack_140 = dVar3 * local_168 - local_158 * dVar9;
            local_138 = local_158 * dVar23 - dStack_150 * dVar3;
            local_1d8[0] = 0.0;
            local_1d8[1] = 0.0;
            local_1d8[2] = 0.0;
            lVar12 = 0;
            do {
              local_1d8[lVar12] = (double)(&local_148)[lVar12].at_ * RVar8 * 23.0609;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_e8[0] = 0.0;
            local_e8[1] = 0.0;
            local_e8[2] = 0.0;
            lVar12 = 0;
            do {
              local_e8[lVar12] = local_1d8[lVar12] * 1e-05;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_188[2] = local_e8[2];
            local_188[0] = local_e8[0];
            local_188[1] = local_e8[1];
            lVar12 = (long)(pAVar5->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            lVar15 = 0;
            do {
              *(double *)(lVar12 + lVar15 * 8) =
                   local_188[lVar15] + *(double *)(lVar12 + lVar15 * 8);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
          }
          local_148.at_ = pAVar6;
          bVar10 = MultipoleAdapter::isDipole(&local_148);
          if (bVar10) {
            lVar15 = (long)(pAVar5->super_StuntDouble).localIndex_;
            lVar12 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).dipole.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            local_1d8[2] = *(double *)(lVar12 + 0x10 + lVar15 * 0x18);
            pdVar1 = (double *)(lVar12 + lVar15 * 0x18);
            local_1d8[0] = *pdVar1;
            local_1d8[1] = pdVar1[1];
            local_e8[0] = 0.0;
            local_e8[1] = 0.0;
            local_e8[2] = 0.0;
            lVar12 = 0;
            do {
              local_e8[lVar12] = local_1d8[lVar12] * 4.8018969509;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            dVar3 = (this->MF).super_Vector<double,_3U>.data_[0];
            dVar23 = (this->MF).super_Vector<double,_3U>.data_[1];
            dVar9 = (this->MF).super_Vector<double,_3U>.data_[2];
            dVar24 = local_168 * dVar3 - dVar9 * local_158;
            dVar22 = local_158 * dVar23 - dVar3 * dStack_150;
            dVar23 = dStack_150 * dVar9 - dVar23 * local_168;
            local_168 = local_e8[2];
            uStack_160 = 0;
            local_158 = local_e8[0];
            dStack_150 = local_e8[1];
            local_98 = local_e8[2];
            dStack_90 = local_e8[0];
            dVar3 = local_e8[2] * dVar23 - dVar22 * local_e8[0];
            local_88 = local_e8[1];
            dStack_80 = local_e8[1];
            local_108._8_4_ = SUB84(dVar3,0);
            local_108._0_8_ = local_e8[1] * dVar22 - dVar24 * local_e8[2];
            local_108._12_4_ = (int)((ulong)dVar3 >> 0x20);
            local_f8 = local_e8[0] * dVar24 - dVar23 * local_e8[1];
            pSVar7 = ((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar12 = (long)(pAVar5->super_StuntDouble).localIndex_;
            lVar15 = lVar12 * 0x18 +
                     *(long *)((long)&(pSVar7->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            lVar17 = 0;
            do {
              *(double *)(lVar15 + lVar17 * 8) =
                   *(double *)(local_108 + lVar17 * 8) + *(double *)(lVar15 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar15 = *(long *)((long)&(pSVar7->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            local_118 = *(undefined8 *)(lVar15 + 0x10 + lVar12 * 0x18);
            puVar2 = (undefined4 *)(lVar15 + lVar12 * 0x18);
            local_128._0_4_ = *puVar2;
            local_128._4_4_ = puVar2[1];
            uStack_120 = puVar2[2];
            uStack_11c = puVar2[3];
            (*(pAVar5->super_StuntDouble)._vptr_StuntDouble[5])((double (*) [3])local_e8,pAVar5);
            padVar13 = (double (*) [3])local_e8;
            pSVar18 = &local_78;
            for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pSVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]
                   = (((SquareMatrix3<double> *)padVar13)->super_SquareMatrix<double,_3>).
                     super_RectMatrix<double,_3U,_3U>.data_[0][0];
              padVar13 = (double (*) [3])((long)padVar13 + ((ulong)bVar20 * -2 + 1) * 8);
              pSVar18 = (SquareMatrix3<double> *)((long)pSVar18 + ((ulong)bVar20 * -2 + 1) * 8);
            }
            if ((pAVar5->super_StuntDouble).linear_ == true) {
              uVar4 = (pAVar5->super_StuntDouble).linearAxis_;
              uVar14 = (ulong)(((int)(uVar4 + 1) / 3) * -3 + uVar4 + 1);
              uVar16 = (ulong)(((int)(uVar4 + 2) / 3) * -3 + uVar4 + 2);
              dVar3 = (double)(&local_128)[uVar14];
              dVar23 = *(double *)
                        ((long)local_78.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_ + uVar14 * 0x20);
              local_1b8[uVar4] = 0.0;
              local_1b8[uVar14] = dVar3 / dVar23;
              local_1b8[uVar16] =
                   (double)(&local_128)[uVar16] /
                   *(double *)
                    ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_ + uVar16 * 0x20);
            }
            else {
              SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_e8,&local_78);
              local_1d8[0] = 0.0;
              local_1d8[1] = 0.0;
              local_1d8[2] = 0.0;
              lVar12 = 0;
              padVar13 = (double (*) [3])local_e8;
              do {
                dVar3 = local_1d8[lVar12];
                lVar15 = 0;
                do {
                  dVar3 = dVar3 + (((SquareMatrix<double,_3> *)*padVar13)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar15] *
                                  (double)(&local_128)[lVar15];
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                local_1d8[lVar12] = dVar3;
                lVar12 = lVar12 + 1;
                padVar13 = padVar13 + 1;
              } while (lVar12 != 3);
              local_1b8[2] = local_1d8[2];
              local_1b8[0] = local_1d8[0];
              local_1b8[1] = local_1d8[1];
            }
            dVar3 = (this->MF).super_Vector<double,_3U>.data_[0];
            dVar21 = local_1b8[1] * local_168 - local_88 * local_1b8[2];
            dVar23 = local_1b8[2] * local_158 - local_98 * local_1b8[0];
            dVar9 = local_1b8[0] * dStack_150 - dStack_90 * local_1b8[1];
            dVar22 = (this->MF).super_Vector<double,_3U>.data_[1];
            dVar24 = (this->MF).super_Vector<double,_3U>.data_[2];
            local_188[0] = dVar24 * dVar23 - dVar9 * dVar22;
            local_188[1] = dVar3 * dVar9 - dVar21 * dVar24;
            local_188[2] = dVar21 * dVar22 - dVar23 * dVar3;
            lVar12 = (long)(pAVar5->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar5->super_StuntDouble).storage_);
            lVar15 = 0;
            do {
              *(double *)(lVar12 + lVar15 * 8) =
                   local_188[lVar15] + *(double *)(lVar12 + lVar15 * 8);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
          }
        }
        pMVar11 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_190);
      } while (pMVar11 != (Molecule *)0x0);
    }
  }
  return;
}

Assistant:

void MagneticField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;

    int l, m, n;
    RealType C;
    Vector3d v;
    Vector3d f;
    Vector3d r;
    Vector3d t;
    Vector3d D;
    Vector3d AngMomentum;
    Vector3d omega;
    Mat3x3d I;
    bool isCharge;

    if (doMagneticField) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();
          r     = atom->getPos();
          v     = atom->getVel();

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          C *= Constants::chargeFieldConvert;

          if (isCharge) {
            f = cross(v, MF) * C * Constants::magneticFieldConvert;
            atom->addFrc(f);
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, cross(v, MF));
            atom->addTrq(t);

            AngMomentum = atom->getJ();
            I           = atom->getI();
            if (atom->isLinear()) {
              l        = atom->linearAxis();
              m        = (l + 1) % 3;
              n        = (l + 2) % 3;
              omega[l] = 0;
              omega[m] = AngMomentum[m] / I(m, m);
              omega[n] = AngMomentum[n] / I(n, n);
            } else {
              omega = I.inverse() * AngMomentum;
            }

            f = cross(cross(omega, D), MF);
            atom->addFrc(f);
          }
        }
      }
    }
  }